

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O1

void __thiscall QPixmap::setDevicePixelRatio(QPixmap *this,qreal scaleFactor)

{
  QPlatformPixmap *pQVar1;
  double extraout_XMM0_Qa;
  
  pQVar1 = (this->data).d.ptr;
  if ((pQVar1 != (QPlatformPixmap *)0x0) && (pQVar1->is_null == false)) {
    (*pQVar1->_vptr_QPlatformPixmap[0x14])();
    if ((extraout_XMM0_Qa != scaleFactor) || (NAN(extraout_XMM0_Qa) || NAN(scaleFactor))) {
      detach(this);
      (*((this->data).d.ptr)->_vptr_QPlatformPixmap[0x15])(scaleFactor);
      return;
    }
  }
  return;
}

Assistant:

void QPixmap::setDevicePixelRatio(qreal scaleFactor)
{
    if (isNull())
        return;

    if (scaleFactor == data->devicePixelRatio())
        return;

    detach();
    data->setDevicePixelRatio(scaleFactor);
}